

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Options::ReporterOptionParser::parseIntoConfig
          (ReporterOptionParser *this,Command *cmd,ConfigData *config)

{
  string local_40;
  ConfigData *local_20;
  ConfigData *config_local;
  Command *cmd_local;
  ReporterOptionParser *this_local;
  
  local_20 = config;
  config_local = (ConfigData *)cmd;
  cmd_local = (Command *)this;
  Command::operator[][abi_cxx11_(&local_40,cmd,0);
  std::__cxx11::string::operator=((string *)local_20,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

virtual void parseIntoConfig( const Command& cmd, ConfigData& config ) {
                config.reporter = cmd[0];
            }